

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execution_environment.cpp
# Opt level: O0

CONTAINER_TYPE license::os::checkContainerProc(void)

{
  __ssize_t _Var1;
  char *pcVar2;
  CONTAINER_TYPE local_34;
  CONTAINER_TYPE result;
  ssize_t read;
  size_t len;
  char *line;
  FILE *fp;
  
  len = 0;
  read = 0;
  local_34 = NONE;
  line = (char *)fopen("/proc/self/cgroup","r");
  if ((FILE *)line == (FILE *)0x0) {
    fp._4_4_ = NONE;
  }
  else {
    while (_Var1 = getline((char **)&len,(size_t *)&read,(FILE *)line),
          _Var1 != -1 && local_34 == NONE) {
      pcVar2 = strstr((char *)len,"docker");
      if (pcVar2 != (char *)0x0) {
        local_34 = DOCKER;
      }
      pcVar2 = strstr((char *)len,"lxc");
      if (pcVar2 != (char *)0x0) {
        local_34 = LXC;
      }
    }
    if (len != 0) {
      free((void *)len);
    }
    fclose((FILE *)line);
    fp._4_4_ = local_34;
  }
  return fp._4_4_;
}

Assistant:

static CONTAINER_TYPE checkContainerProc() {
	// in docer /proc/self/cgroups contains the "docker" or "lxc" string
	// https://stackoverflow.com/questions/23513045/how-to-check-if-a-process-is-running-inside-docker-container

	FILE *fp;
	char *line = nullptr;
	size_t len = 0;
	ssize_t read;
	CONTAINER_TYPE result = CONTAINER_TYPE::NONE;

	fp = fopen("/proc/self/cgroup", "r");
	if (fp == nullptr) {
		return CONTAINER_TYPE::NONE;
	}

	while ((read = getline(&line, &len, fp)) != -1
			&& result == CONTAINER_TYPE::NONE) {
		if (strstr(line, "docker") != NULL) {
			result = CONTAINER_TYPE::DOCKER;
		}
		if (strstr(line, "lxc") != NULL) {
			result = CONTAINER_TYPE::LXC;
		}
	}

	if (line) {
		free(line);
	}
	fclose(fp);
	return result;
}